

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLIDENTICAL3CROWS_FramePP
          (TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000528;
  double *in_stack_00000530;
  double *in_stack_00000538;
  double *in_stack_00000540;
  int in_stack_0000054c;
  int in_stack_00000550;
  int *in_stack_00000560;
  int *in_stack_00000568;
  int *in_stack_00000570;
  
  TVar1 = TA_CDLIDENTICAL3CROWS
                    (in_stack_00000550,in_stack_0000054c,in_stack_00000540,in_stack_00000538,
                     in_stack_00000530,in_stack_00000528,in_stack_00000560,in_stack_00000568,
                     in_stack_00000570);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLIDENTICAL3CROWS_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLIDENTICAL3CROWS(
/* Generated */                            startIdx,
/* Generated */                            endIdx,
/* Generated */                            params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                            params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                            params->in[0].data.inPrice.low, /* inLow */
/* Generated */                            params->in[0].data.inPrice.close, /* inClose */
/* Generated */                            outBegIdx, 
/* Generated */                            outNBElement, 
/* Generated */                            params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }